

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-job.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  char **ppcVar2;
  string *psVar3;
  long *plVar4;
  ostream *poVar5;
  QPDFJob j_1;
  QPDFJob j;
  char *new_argv [11];
  long *local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  long local_128 [2];
  QPDFJob local_118 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  char **local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  undefined8 local_b8;
  string *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  string *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  ppcVar2 = (char **)QUtil::getWhoami(*argv);
  if (argc == 1) {
    QPDFJob::QPDFJob(local_118);
    QPDFJob::config();
    local_108 = &local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"in.pdf","");
    psVar3 = (string *)QPDFJob::Config::inputFile(local_b0);
    local_138 = local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"out1.pdf","");
    QPDFJob::Config::outputFile(psVar3);
    QPDFJob::Config::pages();
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,".","");
    psVar3 = (string *)QPDFJob::PagesConfig::file(local_a0);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"1","");
    QPDFJob::PagesConfig::range(psVar3);
    QPDFJob::PagesConfig::endPages();
    QPDFJob::Config::linearize();
    psVar3 = (string *)QPDFJob::Config::staticId();
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"n","");
    QPDFJob::Config::compressStreams(psVar3);
    QPDFJob::Config::checkConfiguration();
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
    }
    if (local_138 != local_128) {
      operator_delete(local_138,local_128[0] + 1);
    }
    if (local_108 != &local_f8) {
      operator_delete(local_108,(ulong)(local_f8 + 1));
    }
    if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
    }
    QPDFJob::run();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"out1 status: ",0xd);
    iVar1 = QPDFJob::getExitCode();
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
    }
    local_100 = "in.pdf";
    local_f8 = "out2.pdf";
    local_f0 = "--linearize";
    local_e8 = "--pages";
    local_e0 = ".";
    local_d8 = "1";
    local_d0 = "--";
    local_c8 = "--static-id";
    local_c0 = "--compress-streams=n";
    local_b8 = 0;
    local_108 = ppcVar2;
    QPDFJob::QPDFJob((QPDFJob *)&local_138);
    QPDFJob::initializeFromArgv((char **)&local_138,(char *)&local_108);
    QPDFJob::run();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"out2 status: ",0xd);
    iVar1 = QPDFJob::getExitCode();
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
    }
    QPDFJob::QPDFJob((QPDFJob *)&local_138);
    local_108 = &local_f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,
               "{\n  \"inputFile\": \"in.pdf\",\n  \"outputFile\": \"out3.pdf\",\n  \"staticId\": \"\",\n  \"linearize\": \"\",\n  \"compressStreams\": \"n\",\n  \"pages\": [\n    {\n      \"file\": \".\",\n      \"range\": \"1\"\n    }\n  ]\n}\n"
               ,"");
    QPDFJob::initializeFromJson((string *)&local_138,SUB81(&local_108,0));
    if (local_108 != &local_f8) {
      operator_delete(local_108,(ulong)(local_f8 + 1));
    }
    QPDFJob::run();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"out3 status: ",0xd);
    iVar1 = QPDFJob::getExitCode();
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
    }
    return 0;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar5 = std::operator<<(poVar5,(char *)ppcVar2);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,
                           "This program linearizes the first page of in.pdf to out1.pdf, out2.pdf, and"
                          );
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,
                           " out3.pdf, each demonstrating a different way to use the QPDFJob API");
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(2);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if (argc != 1) {
        usage();
    }

    // The examples below all catch std::exception. Note that QPDFUsage can be caught separately to
    // report on errors in using the API itself. For CLI, this is command-line usage. For JSON or
    // the API, it would be errors from the equivalent invocation.

    // Note that staticId is used for testing only.

    try {
        // Use the config API
        QPDFJob j;
        j.config()
            ->inputFile("in.pdf")
            ->outputFile("out1.pdf")
            ->pages()
            // Prior to qpdf 11.9.0, call ->pageSpec(file, range, password)
            ->file(".")
            ->range("1")
            ->endPages()
            ->linearize()
            ->staticId()           // for testing only
            ->compressStreams("n") // avoid dependency on zlib output
            ->checkConfiguration();
        j.run();
        std::cout << "out1 status: " << j.getExitCode() << std::endl;
    } catch (std::exception& e) {
        std::cerr << "exception: " << e.what() << std::endl;
        return 2;
    }

    try {
        char const* new_argv[] = {
            whoami,
            "in.pdf",
            "out2.pdf",
            "--linearize",
            "--pages",
            ".",
            "1",
            "--",
            "--static-id",
            "--compress-streams=n", // avoid dependency on zlib output
            nullptr};
        QPDFJob j;
        j.initializeFromArgv(new_argv);
        j.run();
        std::cout << "out2 status: " << j.getExitCode() << std::endl;
    } catch (std::exception& e) {
        std::cerr << "exception: " << e.what() << std::endl;
        return 2;
    }

    try {
        // Use the JSON API
        QPDFJob j;
        j.initializeFromJson(R"({
  "inputFile": "in.pdf",
  "outputFile": "out3.pdf",
  "staticId": "",
  "linearize": "",
  "compressStreams": "n",
  "pages": [
    {
      "file": ".",
      "range": "1"
    }
  ]
}
)");
        j.run();
        std::cout << "out3 status: " << j.getExitCode() << std::endl;
    } catch (std::exception& e) {
        std::cerr << "exception: " << e.what() << std::endl;
        return 2;
    }

    return 0;
}